

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O3

void do_vararg_push(dill_stream_conflict s,char *arg_str,__va_list_tag *ap)

{
  int iVar1;
  char extraout_AL;
  int iVar2;
  arg_info_list __ptr;
  char *pcVar3;
  char *arg_str_00;
  jmp_table pjVar4;
  double dVar5;
  char *extraout_RDX;
  uint uVar6;
  uint *puVar7;
  undefined8 *puVar8;
  double *pdVar9;
  dill_stream_conflict s_00;
  jmp_table in_R8;
  int iVar10;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar11;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined8 extraout_XMM1_Qa_03;
  int arg_count;
  type_union value [256];
  __va_list_tag _Stack_930;
  undefined1 auStack_910 [32];
  jmp_table pjStack_8f0;
  undefined8 uStack_8d0;
  dill_stream_conflict pdStack_860;
  arg_info_list paStack_858;
  __va_list_tag *p_Stack_850;
  undefined1 auStack_840 [4];
  int local_83c;
  double adStack_838 [257];
  
  p_Stack_850 = (__va_list_tag *)0x10806c;
  __ptr = translate_arg_str(arg_str,&local_83c);
  p_Stack_850 = (__va_list_tag *)0x108085;
  s_00 = s;
  (*s->j->push)(s,0xb,-1);
  iVar1 = s->j->do_reverse_push;
  if (iVar1 != 0) {
    s->p->doing_reverse_push = 1;
  }
  if (0 < (long)local_83c) {
    pcVar3 = &__ptr->is_immediate;
    arg_str_00 = (char *)0x0;
    do {
      uVar11 = extraout_XMM1_Qa;
      if (*pcVar3 == '\0') {
switchD_001080d5_caseD_0:
        uVar6 = ap->gp_offset;
        if ((ulong)uVar6 < 0x29) {
          puVar7 = (uint *)((ulong)uVar6 + (long)ap->reg_save_area);
          s_00 = (dill_stream_conflict)(ulong)(uVar6 + 8);
          ap->gp_offset = uVar6 + 8;
        }
        else {
          puVar7 = (uint *)ap->overflow_arg_area;
          s_00 = (dill_stream_conflict)(puVar7 + 2);
          ap->overflow_arg_area = s_00;
        }
        pdVar9 = (double *)(ulong)*puVar7;
        *(uint *)(adStack_838 + (long)arg_str_00) = *puVar7;
      }
      else {
        pdVar9 = (double *)(ulong)(byte)((arg_info *)(pcVar3 + -2))->type;
        switch(pdVar9) {
        case (double *)0x0:
        case (double *)0x1:
        case (double *)0x2:
        case (double *)0x3:
        case (double *)0x4:
        case (double *)0x5:
          goto switchD_001080d5_caseD_0;
        case (double *)0x6:
        case (double *)0x7:
        case (double *)0x8:
          uVar6 = ap->gp_offset;
          if ((ulong)uVar6 < 0x29) {
            puVar8 = (undefined8 *)((ulong)uVar6 + (long)ap->reg_save_area);
            s_00 = (dill_stream_conflict)(ulong)(uVar6 + 8);
            ap->gp_offset = uVar6 + 8;
          }
          else {
            puVar8 = (undefined8 *)ap->overflow_arg_area;
            s_00 = (dill_stream_conflict)(puVar8 + 1);
            ap->overflow_arg_area = s_00;
          }
          pdVar9 = (double *)*puVar8;
          adStack_838[(long)arg_str_00] = (double)pdVar9;
          break;
        case (double *)0x9:
          uVar6 = ap->fp_offset;
          if ((ulong)uVar6 < 0xa1) {
            pdVar9 = (double *)((ulong)uVar6 + (long)ap->reg_save_area);
            s_00 = (dill_stream_conflict)(ulong)(uVar6 + 0x10);
            ap->fp_offset = uVar6 + 0x10;
          }
          else {
            pdVar9 = (double *)ap->overflow_arg_area;
            s_00 = (dill_stream_conflict)(pdVar9 + 1);
            ap->overflow_arg_area = s_00;
          }
          *(float *)(adStack_838 + (long)arg_str_00) = (float)*pdVar9;
          break;
        case (double *)0xa:
          uVar6 = ap->fp_offset;
          if ((ulong)uVar6 < 0xa1) {
            pdVar9 = (double *)((ulong)uVar6 + (long)ap->reg_save_area);
            s_00 = (dill_stream_conflict)(ulong)(uVar6 + 0x10);
            ap->fp_offset = uVar6 + 0x10;
          }
          else {
            pdVar9 = (double *)ap->overflow_arg_area;
            s_00 = (dill_stream_conflict)(pdVar9 + 1);
            ap->overflow_arg_area = s_00;
          }
          adStack_838[(long)arg_str_00] = *pdVar9;
          break;
        default:
          p_Stack_850 = (__va_list_tag *)0x1082d0;
          do_vararg_push_cold_1();
          goto switchD_001081f9_default;
        }
      }
      arg_str_00 = arg_str_00 + 1;
      pcVar3 = pcVar3 + 0x14;
    } while ((char *)(long)local_83c != arg_str_00);
    if (0 < local_83c) {
      ap = (__va_list_tag *)0x0;
      iVar10 = local_83c;
      do {
        iVar10 = iVar10 + -1;
        iVar2 = iVar10;
        if (iVar1 == 0) {
          iVar2 = (int)ap;
        }
        if (__ptr[iVar2].is_immediate == '\0') {
          in_R8 = s->j;
          uVar6 = (uint)__ptr[iVar2].type;
          pdVar9 = (double *)(ulong)uVar6;
          p_Stack_850 = (__va_list_tag *)0x108221;
          s_00 = s;
          (*in_R8->push)(s,uVar6,*(int *)(adStack_838 + iVar2));
          uVar11 = extraout_XMM1_Qa_00;
          goto LAB_00108272;
        }
        arg_str_00 = (char *)(ulong)(byte)__ptr[iVar2].type;
        switch(arg_str_00) {
        case (char *)0x0:
        case (char *)0x2:
        case (char *)0x4:
          pjVar4 = s->j;
          dVar5 = (double)(long)*(int *)(adStack_838 + iVar2);
          pdVar9 = (double *)0x4;
          break;
        case (char *)0x1:
        case (char *)0x3:
        case (char *)0x5:
          pjVar4 = s->j;
          dVar5 = (double)(ulong)*(uint *)(adStack_838 + iVar2);
          pdVar9 = (double *)0x5;
          break;
        case (char *)0x6:
          pjVar4 = s->j;
          dVar5 = adStack_838[iVar2];
          pdVar9 = (double *)0x6;
          break;
        case (char *)0x7:
          pjVar4 = s->j;
          dVar5 = adStack_838[iVar2];
          pdVar9 = (double *)0x7;
          break;
        case (char *)0x8:
          pdVar9 = (double *)0x8;
          p_Stack_850 = (__va_list_tag *)0x1082b0;
          s_00 = s;
          (*s->j->pushpi)(s,8,(void *)adStack_838[iVar2]);
          uVar11 = extraout_XMM1_Qa_03;
          goto LAB_00108272;
        case (char *)0x9:
          pjVar4 = s->j;
          dVar5 = (double)*(float *)(adStack_838 + iVar2);
          pdVar9 = (double *)0x9;
          goto LAB_00108292;
        case (char *)0xa:
          pjVar4 = s->j;
          dVar5 = adStack_838[iVar2];
          pdVar9 = (double *)0xa;
LAB_00108292:
          p_Stack_850 = (__va_list_tag *)0x108298;
          s_00 = s;
          (*pjVar4->pushfi)(s,(int)pdVar9,dVar5);
          uVar11 = extraout_XMM1_Qa_02;
          goto LAB_00108272;
        default:
switchD_001081f9_default:
          p_Stack_850 = (__va_list_tag *)dill_scalli;
          do_vararg_push_cold_2();
          _Stack_930.reg_save_area = auStack_910;
          if (extraout_AL != '\0') {
            uStack_8d0 = uVar11;
          }
          _Stack_930.overflow_arg_area = auStack_840;
          _Stack_930.gp_offset = 0x20;
          _Stack_930.fp_offset = 0x30;
          pjStack_8f0 = in_R8;
          pdStack_860 = s;
          paStack_858 = __ptr;
          p_Stack_850 = ap;
          do_vararg_push(s_00,arg_str_00,&_Stack_930);
          (*s_00->j->calli)(s_00,4,pdVar9,extraout_RDX);
          return;
        }
        p_Stack_850 = (__va_list_tag *)0x108272;
        s_00 = s;
        (*pjVar4->pushi)(s,(int)pdVar9,(long)dVar5);
        uVar11 = extraout_XMM1_Qa_01;
LAB_00108272:
        ap = (__va_list_tag *)(ulong)((int)ap + 1);
      } while (iVar10 != 0);
    }
  }
  free(__ptr);
  return;
}

Assistant:

static void
do_vararg_push(dill_stream s, const char* arg_str, va_list ap)
{
    int i, arg_count;
    int reverse = 0;
    arg_info_list args = translate_arg_str(arg_str, &arg_count);
    type_union value[256];

    dill_push_init(s);

    reverse = dill_do_reverse_vararg_push(s);

    for (i = 0; i < arg_count; i++) {
        if (!args[i].is_immediate) {
            value[i].i = va_arg(ap, int);
        } else {
            switch (args[i].type) {
            case DILL_UC:
            case DILL_US:
            case DILL_U:
                value[i].u = va_arg(ap, unsigned);
                break;
            case DILL_C:
            case DILL_S:
            case DILL_I:
                value[i].i = va_arg(ap, int);
                break;
            case DILL_L:
                value[i].l = va_arg(ap, long);
                break;
            case DILL_UL:
                value[i].ul = va_arg(ap, unsigned long);
                break;
            case DILL_P:
                value[i].p = va_arg(ap, void*);
                break;
            case DILL_F:
                value[i].f = (float)va_arg(ap, double);
                break;
            case DILL_D:
                value[i].d = va_arg(ap, double);
                break;
            default:
                fprintf(stderr, "do_push_args: unknown type\n");
                exit(1);
            }
        }
    }

    /* push all arguments */
    for (i = 0; i < arg_count; i++) {
        int arg = i;
        if (reverse) {
            arg = arg_count - i - 1;
        }
        if (!args[arg].is_immediate) {
            dill_push_arg(s, args[arg].type, value[arg].i);
        } else {
            switch (args[arg].type) {
            case DILL_UC:
            case DILL_US:
            case DILL_U:
                dill_push_argui(s, value[arg].u);
                break;
            case DILL_C:
            case DILL_S:
            case DILL_I:
                dill_push_argii(s, value[arg].i);
                break;
            case DILL_L:
                dill_push_argli(s, value[arg].l);
                break;
            case DILL_UL:
                dill_push_arguli(s, value[arg].ul);
                break;
            case DILL_P:
                dill_push_argpi(s, value[arg].p);
                break;
            case DILL_F:
                dill_push_argfi(s, value[arg].f);
                break;
            case DILL_D:
                dill_push_argdi(s, value[arg].d);
                break;
            default:
                fprintf(stderr, "do_push_args: unknown type\n");
                exit(1);
            }
        }
    }
    free(args);
}